

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O1

void __thiscall
ProgramStreamDemuxer::ProgramStreamDemuxer
          (ProgramStreamDemuxer *this,BufferedReaderManager *readManager)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  AbstractReader *pAVar3;
  
  p_Var1 = &(this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_AbstractDemuxer).m_fileBlockSize = 0x200000;
  (this->super_AbstractDemuxer).m_timeOffset = 0;
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer =
       (_func_int **)&PTR__ProgramStreamDemuxer_00242120;
  memset(this->m_tmpBuffer,0,0x3fa);
  this->m_readManager = readManager;
  this->m_dataProcessed = 0;
  (this->m_streamName)._M_dataplus._M_p = (pointer)&(this->m_streamName).field_2;
  (this->m_streamName)._M_string_length = 0;
  (this->m_streamName).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  memset(this->m_lpcmWaveHeader,0,0x200);
  memset(this->m_psm_es_type,0,0x100);
  this->m_lpcpHeaderAdded[0] = false;
  this->m_lpcpHeaderAdded[1] = false;
  this->m_lpcpHeaderAdded[2] = false;
  this->m_lpcpHeaderAdded[3] = false;
  this->m_lpcpHeaderAdded[4] = false;
  this->m_lpcpHeaderAdded[5] = false;
  this->m_lpcpHeaderAdded[6] = false;
  this->m_lpcpHeaderAdded[7] = false;
  this->m_lpcpHeaderAdded[8] = false;
  this->m_lpcpHeaderAdded[9] = false;
  this->m_lpcpHeaderAdded[10] = false;
  this->m_lpcpHeaderAdded[0xb] = false;
  this->m_lpcpHeaderAdded[0xc] = false;
  this->m_lpcpHeaderAdded[0xd] = false;
  this->m_lpcpHeaderAdded[0xe] = false;
  this->m_lpcpHeaderAdded[0xf] = false;
  pAVar3 = BufferedReaderManager::getReader
                     (this->m_readManager,(this->m_streamName)._M_dataplus._M_p);
  this->m_bufferedReader = pAVar3;
  iVar2 = (*pAVar3->_vptr_AbstractReader[6])(pAVar3,0x3fa);
  this->m_readerID = iVar2;
  this->m_lastReadRez = 0;
  this->m_lastPesLen = 0;
  this->m_lastPID = 0;
  this->m_tmpBufferLen = 0;
  *(undefined4 *)&this->m_firstVideoPTS = 0xffffffff;
  *(undefined4 *)((long)&this->m_firstVideoPTS + 4) = 0xffffffff;
  *(undefined4 *)&this->m_firstPTS = 0xffffffff;
  *(undefined4 *)((long)&this->m_firstPTS + 4) = 0xffffffff;
  return;
}

Assistant:

ProgramStreamDemuxer::ProgramStreamDemuxer(const BufferedReaderManager& readManager)
    : m_tmpBuffer{}, m_readManager(readManager), m_dataProcessed(0)
{
    memset(m_psm_es_type, 0, sizeof(m_psm_es_type));
    memset(m_lpcpHeaderAdded, 0, sizeof(m_lpcpHeaderAdded));
    m_bufferedReader = m_readManager.getReader(m_streamName.c_str());
    m_readerID = m_bufferedReader->createReader(MAX_PES_HEADER_SIZE);
    m_lastReadRez = 0;
    m_lastPesLen = 0;
    m_lastPID = 0;
    m_tmpBufferLen = 0;
    m_firstPTS = -1;
    m_firstVideoPTS = -1;
}